

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

void __thiscall kratos::UnusedTopBlockVisitor::~UnusedTopBlockVisitor(UnusedTopBlockVisitor *this)

{
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002ad270;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->super_IRVisitor).visited_._M_h);
  operator_delete(this,0x48);
  return;
}

Assistant:

void visit(Generator* generator) override {
        std::set<std::shared_ptr<Stmt>> blocks_to_remove = {};
        uint64_t stmt_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::Block) {
                auto* block = dynamic_cast<StmtBlock*>(stmt.get());
                if (block->empty()) blocks_to_remove.emplace(stmt);
            }
        }

        for (auto const& stmt : blocks_to_remove) {
            generator->remove_stmt(stmt);
        }
    }